

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O0

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::add_srv(raft_server *this,srv_config *srv)

{
  element_type *this_00;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *__x;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  msg_type *in_RSI;
  element_type *in_RDI;
  ptr<cmd_result<ptr<buffer>_>_> pVar1;
  ptr<req_msg> req;
  ptr<log_entry> log;
  ptr<buffer> buf;
  req_ext_params *in_stack_00000478;
  ptr<req_msg> *in_stack_00000480;
  raft_server *in_stack_00000488;
  log_val_type *in_stack_ffffffffffffff08;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffff10;
  _Any_data *this_01;
  unsigned_long *in_stack_ffffffffffffff18;
  element_type *args_2;
  srv_config *this_02;
  unsigned_long *in_stack_ffffffffffffff50;
  unsigned_long *in_stack_ffffffffffffff58;
  _Any_data local_90;
  undefined8 local_80;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined1 local_3d;
  undefined4 local_3c;
  
  this_02 = (srv_config *)&stack0xffffffffffffffd8;
  args_2 = in_RDI;
  srv_config::serialize(this_02);
  local_3c = 0;
  local_3d = 3;
  cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
            ((int *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_68 = 0;
  local_6c = 6;
  local_70 = 0;
  local_74 = 0;
  local_80 = 0;
  local_90._8_8_ = 0;
  local_90._M_unused._M_object = (void *)0x0;
  this_01 = &local_90;
  cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
            ((unsigned_long *)this_02,in_RSI,(int *)args_2,(int *)in_RDI,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1b3577);
  __x = req_msg::log_entries(this_00);
  std::
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>::
  push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             *)in_RDI,(value_type *)__x);
  req_ext_params::req_ext_params((req_ext_params *)this_01);
  send_msg_to_leader(in_stack_00000488,in_stack_00000480,in_stack_00000478);
  req_ext_params::~req_ext_params((req_ext_params *)0x1b35ce);
  std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x1b35db);
  std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x1b35e8);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1b35f5);
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  pVar1.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = args_2;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar1.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::add_srv(const srv_config& srv)
{
    ptr<buffer> buf(srv.serialize());
    ptr<log_entry> log( cs_new<log_entry>
                        ( 0, buf, log_val_type::cluster_server ) );
    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::add_server_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 );
    req->log_entries().push_back(log);
    return send_msg_to_leader(req);
}